

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O0

Qiniu_Error
Qiniu_RS_BatchChangeMime
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryChangeMime *entries,
          Qiniu_ItemCount entryCount)

{
  char *body_00;
  Qiniu_RS_BatchItemRet *self_00;
  char *pcVar1;
  size_t bodyLen;
  Qiniu_Int64 QVar2;
  Qiniu_Error QVar3;
  undefined4 uStack_c4;
  char *url;
  char *local_a0;
  char *rsHost;
  Qiniu_RS_EntryChangeMime *entry;
  Qiniu_ItemCount retSize;
  Qiniu_ItemCount curr;
  char *bodyPart;
  char *opBody;
  char *mimeEncoded;
  char *entryURIEncoded;
  char *entryURI;
  char *bodyTmp;
  char *body;
  cJSON *dataItem;
  cJSON *arrayItem;
  cJSON *root;
  int code;
  Qiniu_ItemCount entryCount_local;
  Qiniu_RS_EntryChangeMime *entries_local;
  Qiniu_RS_BatchItemRet *rets_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  bodyTmp = (char *)0x0;
  entryURI = (char *)0x0;
  entry._4_4_ = 0;
  entry._0_4_ = 0;
  rsHost = (char *)entries;
  root._4_4_ = entryCount;
  _code = entries;
  entries_local = (Qiniu_RS_EntryChangeMime *)rets;
  rets_local = (Qiniu_RS_BatchItemRet *)self;
  QVar3 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_a0);
  err._0_8_ = QVar3.message;
  self_local = (Qiniu_Client *)CONCAT44(url._4_4_,QVar3.code);
  if (QVar3.code == 200) {
    pcVar1 = Qiniu_String_Concat2(local_a0,"/batch");
    entry._4_4_ = 0;
    while (self_00 = rets_local, body_00 = bodyTmp, entry._4_4_ < root._4_4_) {
      entryURIEncoded = Qiniu_String_Concat3(*(char **)rsHost,":",*(char **)(rsHost + 8));
      mimeEncoded = Qiniu_String_Encode(entryURIEncoded);
      opBody = Qiniu_String_Encode(*(char **)(rsHost + 0x10));
      _retSize = Qiniu_String_Concat(mimeEncoded,"/mime/",opBody,0);
      bodyPart = Qiniu_String_Concat2("op=/chgm/",_retSize);
      Qiniu_Free(entryURIEncoded);
      Qiniu_Free(mimeEncoded);
      Qiniu_Free(opBody);
      Qiniu_Free(_retSize);
      if (bodyTmp == (char *)0x0) {
        entryURI = bodyPart;
      }
      else {
        entryURI = Qiniu_String_Concat3(bodyTmp,"&",bodyPart);
        free(bodyPart);
      }
      free(bodyTmp);
      bodyTmp = entryURI;
      entry._4_4_ = entry._4_4_ + 1;
      rsHost = (char *)(_code + entry._4_4_);
    }
    bodyLen = strlen(bodyTmp);
    QVar3 = Qiniu_Client_CallWithBuffer
                      ((Qiniu_Client *)self_00,&arrayItem,pcVar1,body_00,bodyLen,
                       "application/x-www-form-urlencoded");
    err._0_8_ = QVar3.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_c4,QVar3.code);
    free(pcVar1);
    free(bodyTmp);
    entry._0_4_ = cJSON_GetArraySize(arrayItem);
    for (entry._4_4_ = 0; entry._4_4_ < (int)entry; entry._4_4_ = entry._4_4_ + 1) {
      dataItem = cJSON_GetArrayItem(arrayItem,entry._4_4_);
      QVar2 = Qiniu_Json_GetInt64(dataItem,"code",0);
      root._0_4_ = (int)QVar2;
      body = (char *)cJSON_GetObjectItem(dataItem,"data");
      *(int *)(&entries_local->key + (long)entry._4_4_ * 2) = (int)root;
      if ((int)root != 200) {
        pcVar1 = Qiniu_Json_GetString((Qiniu_Json *)body,"error",(char *)0x0);
        (&entries_local->bucket)[(long)entry._4_4_ * 2] = pcVar1;
      }
    }
  }
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchChangeMime(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                     Qiniu_RS_EntryChangeMime *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *mimeEncoded, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryChangeMime *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);
        mimeEncoded = Qiniu_String_Encode(entry->mime);

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/mime/", mimeEncoded, NULL);
        opBody = Qiniu_String_Concat2("op=/chgm/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(mimeEncoded);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}